

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O3

Stream * __thiscall Log::Stream::operator<<(Stream *this,char *val)

{
  ostream *poVar1;
  allocator<char> local_39;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  poVar1 = this->stream;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,val,&local_39);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return this;
}

Assistant:

Stream & operator << (const char val[]) {
      *stream << std::string(val);
      return *this;
    }